

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# complexwidgets.cpp
# Opt level: O2

QString * __thiscall
QAccessibleTabButton::text(QString *__return_storage_ptr__,QAccessibleTabButton *this,Text t)

{
  Data *pDVar1;
  char16_t *pcVar2;
  qsizetype qVar3;
  char cVar4;
  QTypedArrayData<char16_t> *tmp;
  char16_t *tmp_1;
  QArrayDataPointer<char16_t> *this_00;
  long in_FS_OFFSET;
  QArrayDataPointer<char16_t> local_70;
  QArrayDataPointer<char16_t> local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  cVar4 = (**(code **)(*(long *)this + 0x10))(this);
  if (cVar4 == '\0') {
    if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
      (__return_storage_ptr__->d).d = (Data *)0x0;
      (__return_storage_ptr__->d).ptr = (char16_t *)0x0;
      (__return_storage_ptr__->d).size = 0;
      return __return_storage_ptr__;
    }
    goto LAB_004cc638;
  }
  (__return_storage_ptr__->d).d = (Data *)0x0;
  (__return_storage_ptr__->d).ptr = (char16_t *)0x0;
  (__return_storage_ptr__->d).size = 0;
  switch(t) {
  case Name:
    QTabBar::accessibleTabName
              ((QString *)&local_58,(QTabBar *)(this->m_parent).wp.value,this->m_index);
    qVar3 = local_58.size;
    pcVar2 = local_58.ptr;
    pDVar1 = local_58.d;
    local_58.d = (Data *)0x0;
    (__return_storage_ptr__->d).d = pDVar1;
    (__return_storage_ptr__->d).ptr = local_58.ptr;
    local_58.ptr = (char16_t *)0x0;
    (__return_storage_ptr__->d).size = local_58.size;
    local_58.size = 0;
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_58);
    if (qVar3 == 0) {
      QTabBar::tabText((QString *)&local_70,(QTabBar *)(this->m_parent).wp.value,this->m_index);
      qt_accStripAmp((QString *)&local_58,(QString *)&local_70);
      (__return_storage_ptr__->d).d = local_58.d;
      (__return_storage_ptr__->d).ptr = local_58.ptr;
      local_58.d = pDVar1;
      local_58.ptr = pcVar2;
      goto LAB_004cc5f9;
    }
    break;
  case Description:
    QTabBar::tabToolTip((QString *)&local_58,(QTabBar *)(this->m_parent).wp.value,this->m_index);
    goto LAB_004cc59e;
  case Help:
    QTabBar::tabWhatsThis((QString *)&local_58,(QTabBar *)(this->m_parent).wp.value,this->m_index);
LAB_004cc59e:
    pDVar1 = local_58.d;
    this_00 = &local_58;
    local_58.d = (Data *)0x0;
    (__return_storage_ptr__->d).d = pDVar1;
    (__return_storage_ptr__->d).ptr = local_58.ptr;
    local_58.ptr = (char16_t *)0x0;
    (__return_storage_ptr__->d).size = local_58.size;
    local_58.size = 0;
LAB_004cc60e:
    QArrayDataPointer<char16_t>::~QArrayDataPointer(this_00);
    break;
  case Accelerator:
    QTabBar::tabText((QString *)&local_70,(QTabBar *)(this->m_parent).wp.value,this->m_index);
    qt_accHotKey((QString *)&local_58,(QString *)&local_70);
    pDVar1 = local_58.d;
    local_58.d = (Data *)0x0;
    (__return_storage_ptr__->d).d = pDVar1;
    (__return_storage_ptr__->d).ptr = local_58.ptr;
    local_58.ptr = (char16_t *)0x0;
LAB_004cc5f9:
    this_00 = &local_70;
    (__return_storage_ptr__->d).size = local_58.size;
    local_58.size = 0;
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_58);
    goto LAB_004cc60e;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return __return_storage_ptr__;
  }
LAB_004cc638:
  __stack_chk_fail();
}

Assistant:

QString text(QAccessible::Text t) const override
    {
        if (!isValid())
            return QString();
        QString str;
        switch (t) {
        case QAccessible::Name:
            str = m_parent->accessibleTabName(m_index);
            if (str.isEmpty())
                str = qt_accStripAmp(m_parent->tabText(m_index));
            break;
        case QAccessible::Accelerator:
            str = qt_accHotKey(m_parent->tabText(m_index));
            break;
#if QT_CONFIG(tooltip)
        case QAccessible::Description:
            str = m_parent->tabToolTip(m_index);
            break;
#endif
#if QT_CONFIG(whatsthis)
        case QAccessible::Help:
            str = m_parent->tabWhatsThis(m_index);
            break;
#endif
        default:
            break;
        }
        return str;
    }